

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

Integer has_negative_elem(Integer g_a,Integer *alo,Integer *ahi)

{
  long *plVar1;
  long *plVar2;
  Integer IVar3;
  int iVar4;
  logical lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  Integer icode;
  char *A_ptr;
  Integer andim;
  Integer atype;
  Integer *local_540;
  Integer *local_538;
  char *local_530;
  Integer loA [7];
  Integer hiA [7];
  Integer ldA [7];
  long lStack_470;
  Integer local_468;
  long local_460 [7];
  Integer bunit [7];
  Integer loS [7];
  long local_3a8 [8];
  Integer adims [7];
  _iterator_hdl hdl;
  
  pnga_nodeid();
  pnga_sync();
  pnga_check_handle(g_a,"has_negative_elem");
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_total_blocks(g_a);
  for (lVar10 = 0; lVar10 < andim; lVar10 = lVar10 + 1) {
    if ((alo[lVar10] < 1) || (adims[lVar10] < ahi[lVar10])) {
      pnga_error("g_a indices out of range ",g_a);
    }
  }
  pnga_local_iterator_init(g_a,&hdl);
  lVar10 = 1;
  lVar9 = 0;
  local_540 = alo;
  local_538 = ahi;
  do {
    do {
      iVar4 = pnga_local_iterator_next(&hdl,loA,hiA,&A_ptr,ldA);
      if (iVar4 == 0) {
        pnga_sync();
        return lVar9;
      }
      lVar8 = 0;
      if (0 < andim) {
        lVar8 = andim;
      }
      for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
        loS[lVar7] = loA[lVar7];
      }
      lVar5 = pnga_patch_intersect(alo,ahi,loA,hiA,andim);
    } while (lVar5 == 0);
    lVar9 = 0;
    if (0 < andim) {
      lVar9 = andim;
    }
    lVar8 = 0;
    do {
      lVar7 = lVar10;
      lVar11 = lVar10;
      icode = atype;
      if (lVar9 == lVar8) goto LAB_0010e772;
      plVar2 = loS + lVar8;
      plVar1 = loA + lVar8;
      lVar8 = lVar8 + 1;
    } while (*plVar1 <= *plVar2);
    lVar9 = andim + -1;
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    lVar6 = 0;
    lVar8 = lVar10;
    for (lVar12 = 0; lVar9 != lVar12; lVar12 = lVar12 + 1) {
      lVar6 = lVar6 + (loA[lVar12] - loS[lVar12]) * lVar8;
      lVar8 = lVar8 * ldA[lVar12];
    }
    if (6 < atype - 0x3e9U) {
switchD_0010e6f0_caseD_3ed:
      pnga_error(" wrong data type ",atype);
      icode = atype;
      goto LAB_0010e772;
    }
    lVar6 = (loA[andim + -1] - loS[andim + -1]) * lVar8 + lVar6;
    switch(atype) {
    case 0x3e9:
      A_ptr = A_ptr + lVar6 * 4;
      icode = 0x3e9;
      break;
    case 0x3ea:
      A_ptr = A_ptr + lVar6 * 8;
      icode = 0x3ea;
      break;
    case 0x3eb:
      A_ptr = A_ptr + lVar6 * 4;
      icode = 0x3eb;
      break;
    case 0x3ec:
      A_ptr = A_ptr + lVar6 * 8;
      icode = 0x3ec;
      break;
    case 0x3ed:
      goto switchD_0010e6f0_caseD_3ed;
    case 0x3ee:
      lVar6 = lVar6 * 8;
      goto LAB_0010e75f;
    case 0x3ef:
      lVar6 = lVar6 * 0x10;
LAB_0010e75f:
      A_ptr = A_ptr + lVar6;
    }
LAB_0010e772:
    for (; IVar3 = andim, lVar7 < andim; lVar7 = lVar7 + 1) {
      plVar1 = hiA + lVar7;
      plVar2 = loA + lVar7;
      lVar11 = lVar11 * ((*plVar1 - *plVar2) + 1);
    }
    local_3a8[0] = 0;
    local_3a8[1] = 0;
    bunit[0] = 1;
    bunit[1] = 1;
    local_468 = ldA[0];
    local_460[0] = ldA[0] * ldA[1];
    for (lVar9 = 2; lVar9 < andim; lVar9 = lVar9 + 1) {
      local_3a8[lVar9] = 0;
      bunit[lVar9] = ((hiA[lVar9 + -1] - loA[lVar9 + -1]) + 1) * bunit[lVar9 + -1];
      (&local_468)[lVar9] = ldA[lVar9] * (&lStack_470)[lVar9];
    }
    local_530 = A_ptr;
    if (lVar11 < 1) {
      lVar11 = 0;
    }
    lVar9 = 0;
    lVar8 = 0;
    while (alo = local_540, ahi = local_538, lVar8 != lVar11) {
      lVar8 = lVar8 + 1;
      lVar6 = 0;
      for (lVar7 = lVar10; lVar7 < IVar3; lVar7 = lVar7 + 1) {
        lVar6 = lVar6 + (&lStack_470)[lVar7] * local_3a8[lVar7];
        lVar13 = local_3a8[lVar7] + (ulong)(lVar8 % bunit[lVar7] == 0);
        lVar12 = 0;
        if (lVar13 <= hiA[lVar7] - loA[lVar7]) {
          lVar12 = lVar13;
        }
        local_3a8[lVar7] = lVar12;
      }
      switch(icode) {
      case 0x3e9:
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          if (*(int *)(local_530 + lVar7 * 4 + lVar6 * 4) < 0) {
            lVar9 = lVar10;
          }
        }
        break;
      case 0x3ea:
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          if (*(long *)(local_530 + lVar7 * 8 + lVar6 * 8) < 0) {
            lVar9 = lVar10;
          }
        }
        break;
      case 0x3eb:
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          if (*(float *)(local_530 + lVar7 * 4 + lVar6 * 4) <= 0.0 &&
              *(float *)(local_530 + lVar7 * 4 + lVar6 * 4) != 0.0) {
            lVar9 = lVar10;
          }
        }
        break;
      case 0x3ec:
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          if (*(double *)(local_530 + lVar7 * 8 + lVar6 * 8) <= 0.0 &&
              *(double *)(local_530 + lVar7 * 8 + lVar6 * 8) != 0.0) {
            lVar9 = lVar10;
          }
        }
        break;
      default:
        pnga_error(" has_negative_elem: wrong data type ",icode);
      }
    }
  } while( true );
}

Assistant:

static Integer has_negative_elem(g_a, alo, ahi)
Integer g_a, *alo, *ahi;    /* patch of g_a */
/*returned value: 1=found; 0 = not found*/
{
  Integer i;
  Integer atype;
  Integer andim, adims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  char *A_ptr; 
  Integer iretval = 0;
  Integer num_blocks;
  Integer me= pnga_nodeid();
  _iterator_hdl hdl;


  pnga_sync();
  pnga_check_handle(g_a, "has_negative_elem");

  pnga_inquire(g_a, &atype, &andim, adims);
  num_blocks = pnga_total_blocks(g_a);

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl, loA, hiA, &A_ptr, ldA)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    /* loA is changed by pnga_patch_intersect, so
     *            save a copy */
    for (j=0; j<andim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<andim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<andim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ldA[j];
        }
        offset += (loA[andim-1]-loS[andim-1])*jtmp;
        switch (atype){
          case C_INT:
            A_ptr = (void*)((int*)A_ptr + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((double*)A_ptr + 2*offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((float*)A_ptr + 2*offset);
            break;
          case C_DBL:
            A_ptr = (void*)((double*)A_ptr + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)A_ptr + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)A_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",atype);
        }
      }

      /* check all values in patch */
      ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);
    }
  }
#else
  if (num_blocks < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution(g_a, me, loA, hiA);
    iretval = 0;
    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
      pnga_access_ptr(g_a, loA, hiA, &A_ptr, ldA);

      ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

      /* release access to the data */
      pnga_release (g_a, loA, hiA);
    }
  } else {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM], nproc;
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
         *            save a copy */
        for (j=0; j<andim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &A_ptr, ldA);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<andim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<andim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ldA[j];
            }
            offset += (loA[andim-1]-loS[andim-1])*jtmp;
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)A_ptr + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((double*)A_ptr + 2*offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((float*)A_ptr + 2*offset);
                break;
              case C_DBL:
                A_ptr = (void*)((double*)A_ptr + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)A_ptr + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)A_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",atype);
            }
          }

          /* check all values in patch */
          ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
        }
        /* loA is changed by pnga_patch_intersect, so
         *            save a copy */
        for (j=0; j<andim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &A_ptr, ldA);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<andim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<andim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ldA[j];
            }
            offset += (loA[andim-1]-loS[andim-1])*jtmp;
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)A_ptr + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((double*)A_ptr + 2*offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((float*)A_ptr + 2*offset);
                break;
              case C_DBL:
                A_ptr = (void*)((double*)A_ptr + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)A_ptr + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)A_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",atype);
            }
          }

          /* check all values in patch */
          ngai_has_negative_element(atype, andim, loA, hiA, ldA, A_ptr, &iretval);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }

        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  pnga_sync();
  return iretval; /*negative element is not found in g_a*/
}